

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
ExplicitProducer::new_block_index(ExplicitProducer *this,size_t numberOfFilledSlotsToExpose)

{
  BlockIndexEntry *pBVar1;
  __pointer_type __p;
  BlockIndexEntry *pBVar2;
  ulong uVar3;
  size_t sVar4;
  BlockIndexHeader *header;
  size_t i;
  size_t j;
  BlockIndexEntry *newBlockIndexEntries;
  char *newRawPtr;
  size_t prevBlockSizeMask;
  size_t numberOfFilledSlotsToExpose_local;
  ExplicitProducer *this_local;
  memory_order __b;
  
  uVar3 = this->pr_blockIndexSize - 1;
  this->pr_blockIndexSize = this->pr_blockIndexSize << 1;
  __p = (__pointer_type)ConcurrentQueueDefaultTraits::malloc(this->pr_blockIndexSize * 0x10 + 0x27);
  if (__p == (__pointer_type)0x0) {
    this->pr_blockIndexSize = this->pr_blockIndexSize >> 1;
    this_local._7_1_ = false;
  }
  else {
    pBVar2 = (BlockIndexEntry *)
             details::
             align_for<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer::BlockIndexEntry>
                       ((char *)(__p + 1));
    i = 0;
    if (this->pr_blockIndexSlotsUsed != 0) {
      header = (BlockIndexHeader *)(this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed & uVar3)
      ;
      do {
        pBVar1 = this->pr_blockIndexEntries;
        sVar4 = i + 1;
        pBVar2[i].base = pBVar1[(long)header].base;
        pBVar2[i].block = pBVar1[(long)header].block;
        header = (BlockIndexHeader *)((ulong)((long)&header->size + 1U) & uVar3);
        i = sVar4;
      } while (header != (BlockIndexHeader *)this->pr_blockIndexFront);
    }
    __p->size = this->pr_blockIndexSize;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (__p->front).super___atomic_base<unsigned_long>._M_i = numberOfFilledSlotsToExpose - 1;
    __p->entries = pBVar2;
    __p->prev = this->pr_blockIndexRaw;
    this->pr_blockIndexFront = i;
    this->pr_blockIndexEntries = pBVar2;
    this->pr_blockIndexRaw = __p;
    std::
    atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer::BlockIndexHeader_*>
    ::store(&this->blockIndex,__p,memory_order_release);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool new_block_index(size_t numberOfFilledSlotsToExpose)
		{
			auto prevBlockSizeMask = pr_blockIndexSize - 1;
			
			// Create the new block
			pr_blockIndexSize <<= 1;
			auto newRawPtr = static_cast<char*>((Traits::malloc)(sizeof(BlockIndexHeader) + std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * pr_blockIndexSize));
			if (newRawPtr == nullptr) {
				pr_blockIndexSize >>= 1;		// Reset to allow graceful retry
				return false;
			}
			
			auto newBlockIndexEntries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(newRawPtr + sizeof(BlockIndexHeader)));
			
			// Copy in all the old indices, if any
			size_t j = 0;
			if (pr_blockIndexSlotsUsed != 0) {
				auto i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & prevBlockSizeMask;
				do {
					newBlockIndexEntries[j++] = pr_blockIndexEntries[i];
					i = (i + 1) & prevBlockSizeMask;
				} while (i != pr_blockIndexFront);
			}
			
			// Update everything
			auto header = new (newRawPtr) BlockIndexHeader;
			header->size = pr_blockIndexSize;
			header->front.store(numberOfFilledSlotsToExpose - 1, std::memory_order_relaxed);
			header->entries = newBlockIndexEntries;
			header->prev = pr_blockIndexRaw;		// we link the new block to the old one so we can free it later
			
			pr_blockIndexFront = j;
			pr_blockIndexEntries = newBlockIndexEntries;
			pr_blockIndexRaw = newRawPtr;
			blockIndex.store(header, std::memory_order_release);
			
			return true;
		}